

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

String<char> * __thiscall Qentem::String<char>::operator=(String<char> *this,String<char> *src)

{
  if (this != src) {
    deallocate(this);
    copyString(this,src->storage_,src->length_);
  }
  return this;
}

Assistant:

String &operator=(const String &src) {
        if (this != &src) {
            deallocate();
            copyString(src.First(), src.Length());
        }

        return *this;
    }